

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
PreciseMeasurement_doubleOps_Test::~PreciseMeasurement_doubleOps_Test
          (PreciseMeasurement_doubleOps_Test *this)

{
  PreciseMeasurement_doubleOps_Test *this_local;
  
  ~PreciseMeasurement_doubleOps_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PreciseMeasurement, doubleOps)
{
    auto freq = 9.0 / precise::s;
    EXPECT_EQ(freq.units(), precise::one / precise::s);
    auto freq2 = 9.0 * precise::Hz;
    EXPECT_TRUE(freq == freq2);

    auto freq3 = precise::Hz / (1.0 / 9.0);
    EXPECT_TRUE(freq3 == freq2);

    auto fd3 = freq / 3;
    EXPECT_DOUBLE_EQ(fd3.value(), 3.0);

    auto fd9 = freq * 3;
    EXPECT_DOUBLE_EQ(fd9.value(), 27.0);

    auto fd10 = 3.0 * freq;
    EXPECT_DOUBLE_EQ(fd10.value(), 27.0);
    auto fd2 = 27.0 / freq;
    EXPECT_DOUBLE_EQ(fd2.value(), 3.0);
    EXPECT_EQ(fd2.units(), precise::s);

    auto fd6 = precise::Hz * 9.0;
    EXPECT_TRUE(fd6 == freq2);

    auto fd7 = 9.0 / precise::s;
    EXPECT_TRUE(fd7 == freq2);

    auto fd8 = precise::Hz / 0.5;
    EXPECT_DOUBLE_EQ(fd8.value(), 2.0);
}